

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileImporter::createMaterials
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,ZipArchiveIOSystem *pArchive)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiMaterial **ppaVar5;
  pointer ppVar6;
  aiMaterial *this_00;
  const_reference ppsVar7;
  Logger *this_01;
  size_type sVar8;
  aiTexture **ppaVar9;
  iterator __first;
  iterator __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  allocator local_4d9;
  undefined1 local_4d8 [8];
  string texName;
  undefined1 local_4b0 [8];
  string tmp;
  sQ3BSPTexture *pTexture;
  aiMaterial *pMatHelper;
  undefined1 local_468 [8];
  string matName;
  _Self local_440;
  FaceMapIt it;
  int local_430;
  int lightmapId;
  int textureId;
  aiString aiMatName;
  ZipArchiveIOSystem *pArchive_local;
  aiScene *pScene_local;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  aiMatName.data._1016_8_ = pArchive;
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
          ::empty(&this->m_MaterialLookupMap);
  if (!bVar2) {
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
            ::size(&this->m_MaterialLookupMap);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiMaterial **)operator_new__(uVar4);
    pScene->mMaterials = ppaVar5;
    aiString::aiString((aiString *)&lightmapId);
    local_430 = -1;
    it._M_node._4_4_ = -1;
    local_440._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
         ::begin(&this->m_MaterialLookupMap);
    while( true ) {
      matName.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
           ::end(&this->m_MaterialLookupMap);
      bVar2 = std::operator!=(&local_440,(_Self *)((long)&matName.field_2 + 8));
      if (!bVar2) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>
               ::operator->(&local_440);
      std::__cxx11::string::string((string *)local_468,(string *)ppVar6);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        aiString::Set((aiString *)&lightmapId,(string *)local_468);
        this_00 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_00);
        aiMaterial::AddProperty(this_00,(aiString *)&lightmapId,"?mat.name",0,0);
        extractIds((string *)local_468,&local_430,(int *)((long)&it._M_node + 4));
        if (local_430 != -1) {
          ppsVar7 = std::
                    vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                    ::operator[](&pModel->m_Textures,(long)local_430);
          tmp.field_2._8_8_ = *ppsVar7;
          if ((value_type)tmp.field_2._8_8_ != (value_type)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_4b0,"*",(allocator *)(texName.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(texName.field_2._M_local_buf + 0xf));
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)local_4d8,"",&local_4d9);
            std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
            std::__cxx11::string::operator+=((string *)local_4b0,(char *)tmp.field_2._8_8_);
            std::__cxx11::string::operator+=((string *)local_4b0,".jpg");
            normalizePathName((string *)local_4b0,(string *)local_4d8);
            bVar2 = importTextureFromArchive
                              (this,pModel,(ZipArchiveIOSystem *)aiMatName.data._1016_8_,pScene,
                               this_00,local_430);
            if (!bVar2) {
              this_01 = DefaultLogger::get();
              std::operator+(&local_500,"Cannot import texture from archive ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4d8);
              Logger::error(this_01,&local_500);
              std::__cxx11::string::~string((string *)&local_500);
            }
            std::__cxx11::string::~string((string *)local_4d8);
            std::__cxx11::string::~string((string *)local_4b0);
          }
        }
        if (it._M_node._4_4_ != -1) {
          importLightmap(this,pModel,pScene,this_00,it._M_node._4_4_);
        }
        pScene->mMaterials[pScene->mNumMaterials] = this_00;
        pScene->mNumMaterials = pScene->mNumMaterials + 1;
      }
      std::__cxx11::string::~string((string *)local_468);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>
      ::operator++(&local_440);
    }
    sVar8 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->mTextures);
    pScene->mNumTextures = (uint)sVar8;
    auVar1 = ZEXT416(pScene->mNumTextures) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar9 = (aiTexture **)operator_new__(uVar4);
    pScene->mTextures = ppaVar9;
    __first = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::begin(&this->mTextures);
    __last = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::end(&this->mTextures);
    std::
    copy<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,aiTexture**>
              ((__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__first._M_current,
               (__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__last._M_current,pScene->mTextures);
  }
  return;
}

Assistant:

void Q3BSPFileImporter::createMaterials( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
    ZipArchiveIOSystem *pArchive ) {
    if ( m_MaterialLookupMap.empty() ) {
        return;
    }

    pScene->mMaterials = new aiMaterial*[ m_MaterialLookupMap.size() ];
    aiString aiMatName;
    int textureId( -1 ), lightmapId( -1 );
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end();
        ++it ) {
        const std::string matName( it->first );
        if ( matName.empty() ) {
            continue;
        }

        aiMatName.Set( matName );
        aiMaterial *pMatHelper = new aiMaterial;
        pMatHelper->AddProperty( &aiMatName, AI_MATKEY_NAME );

        extractIds( matName, textureId, lightmapId );

        // Adding the texture
        if ( -1 != textureId ) {
            sQ3BSPTexture *pTexture = pModel->m_Textures[ textureId ];
            if ( nullptr != pTexture ) {
                std::string tmp( "*" ), texName( "" );
                tmp += pTexture->strName;
                tmp += ".jpg";
                normalizePathName( tmp, texName );

                if ( !importTextureFromArchive( pModel, pArchive, pScene, pMatHelper, textureId ) ) {
                    ASSIMP_LOG_ERROR("Cannot import texture from archive " + texName);
                }
            }

        }
        if ( -1 != lightmapId )
        {
            importLightmap( pModel, pScene, pMatHelper, lightmapId );
        }
        pScene->mMaterials[ pScene->mNumMaterials ] = pMatHelper;
        pScene->mNumMaterials++;
    }
    pScene->mNumTextures = static_cast<unsigned int>(mTextures.size());
    pScene->mTextures = new aiTexture*[ pScene->mNumTextures ];
    std::copy( mTextures.begin(), mTextures.end(), pScene->mTextures );
}